

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

bool __thiscall
Clasp::Asp::LogicProgram::extractCore(LogicProgram *this,LitVec *solverCore,LitVec *prgLits)

{
  pointer pVVar1;
  uint uVar2;
  pointer pLVar3;
  SharedContext *pSVar4;
  PrgAtom *pPVar5;
  Id_t IVar6;
  Literal LVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Id_t *x;
  ulong uVar13;
  uint uVar14;
  int local_4c;
  long local_48;
  pointer local_40;
  LitVec *local_38;
  
  (prgLits->ebo_).size = 0;
  uVar2 = (solverCore->ebo_).size;
  if ((ulong)uVar2 == 0) {
    uVar13 = 0;
  }
  else {
    pLVar3 = (solverCore->ebo_).buf;
    pSVar4 = (this->super_ProgramBuilder).ctx_;
    uVar14 = (pSVar4->varInfo_).ebo_.size;
    lVar10 = (ulong)uVar2 * 4;
    uVar13 = 0;
    do {
      uVar12 = pLVar3[uVar13].rep_;
      uVar11 = uVar12 >> 2;
      if (uVar14 <= uVar11) break;
      pVVar1 = (pSVar4->varInfo_).ebo_.buf + uVar11;
      pVVar1->rep = pVVar1->rep | 2U - ((uVar12 & 2) == 0);
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + -4;
    } while (lVar10 != 0);
  }
  local_38 = solverCore;
  if ((uint)uVar13 == uVar2) {
    uVar8 = (ulong)(this->frozen_).ebo_.size;
    if ((uint)uVar13 != 0 && uVar8 != 0) {
      local_40 = (this->frozen_).ebo_.buf;
      lVar10 = uVar8 * 4 + -4;
      lVar9 = 0;
      local_48 = lVar10;
      do {
        IVar6 = getEqNode<bk_lib::pod_vector<Clasp::Asp::PrgAtom*,std::allocator<Clasp::Asp::PrgAtom*>>const>
                          (this,&this->atoms_,*(Id_t *)((long)local_40 + lVar9));
        pPVar5 = (this->atoms_).ebo_.buf[IVar6];
        uVar2 = *(uint *)&(pPVar5->super_PrgHead).field_0x18;
        uVar14 = 0;
        if ((uVar2 >> 0x1e & 1) != 0) {
          uVar14 = ((uint)((~uVar2 & 0x60000000) == 0) ^
                   *(uint *)&(pPVar5->super_PrgHead).super_PrgNode) * 2;
        }
        if ((1 < uVar14) &&
           (lVar10 = local_48,
           (2U - ((uVar14 & 2) == 0) &
           (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf[uVar14 >> 2].rep) != 0)) {
          local_4c = -*(int *)((long)local_40 + lVar9);
          if ((*(int *)&(pPVar5->super_PrgHead).super_PrgNode * 2 ^ uVar14) < 2) {
            local_4c = *(int *)((long)local_40 + lVar9);
          }
          bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prgLits,&local_4c);
          pVVar1 = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf + (uVar14 >> 2);
          pVVar1->rep = pVVar1->rep & ((uVar14 & 2) == 0) - 3U;
          uVar13 = (ulong)((int)uVar13 - 1);
          lVar10 = local_48;
        }
      } while ((lVar10 != lVar9) && (lVar9 = lVar9 + 4, (int)uVar13 != 0));
    }
    uVar8 = (ulong)(this->assume_).ebo_.size;
    if ((uVar8 != 0) && ((int)uVar13 != 0)) {
      x = (Id_t *)(this->assume_).ebo_.buf;
      lVar10 = uVar8 * 4;
      do {
        lVar10 = lVar10 + -4;
        LVar7 = getLiteral(this,*x,(MapLit_t)0x0);
        if ((2U - ((LVar7.rep_ & 2) == 0) &
            (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf[LVar7.rep_ >> 2].rep) != 0) {
          bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prgLits,(int *)x);
          pVVar1 = (((this->super_ProgramBuilder).ctx_)->varInfo_).ebo_.buf + (LVar7.rep_ >> 2);
          pVVar1->rep = pVVar1->rep & ((LVar7.rep_ & 2) == 0) - 3U;
          uVar13 = (ulong)((int)uVar13 - 1);
        }
      } while ((lVar10 != 0) && (x = x + 1, (int)uVar13 != 0));
    }
  }
  uVar2 = (local_38->ebo_).size;
  if ((ulong)uVar2 != 0) {
    pLVar3 = (local_38->ebo_).buf;
    pSVar4 = (this->super_ProgramBuilder).ctx_;
    uVar14 = (pSVar4->varInfo_).ebo_.size;
    lVar10 = 0;
    do {
      uVar12 = *(uint *)((long)&pLVar3->rep_ + lVar10) >> 2;
      if (uVar12 < uVar14) {
        pVVar1 = (pSVar4->varInfo_).ebo_.buf + uVar12;
        pVVar1->rep = pVVar1->rep & 0xfc;
      }
      lVar10 = lVar10 + 4;
    } while ((ulong)uVar2 * 4 - lVar10 != 0);
  }
  return (prgLits->ebo_).size == uVar2;
}

Assistant:

bool LogicProgram::extractCore(const LitVec& solverCore, Potassco::LitVec& prgLits) const 	{
	uint32 marked = 0;
	prgLits.clear();
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (!ctx()->validVar(it->var())) { break; }
		ctx()->mark(*it);
		++marked;
	}
	if (marked == solverCore.size()) {
		for (VarVec::const_iterator it = frozen_.begin(), end = frozen_.end(); it != end && marked; ++it) {
			PrgAtom* atom = getRootAtom(*it);
			Literal lit = atom->assumption();
			if (lit == lit_true() || !ctx()->marked(lit)) continue;
			prgLits.push_back(atom->literal() == lit ? Potassco::lit(*it) : Potassco::neg(*it));
			ctx()->unmark(lit);
			--marked;
		}
		for (Potassco::LitVec::const_iterator it = assume_.begin(), end = assume_.end(); it != end && marked; ++it) {
			Literal lit = getLiteral(Potassco::id(*it));
			if (!ctx()->marked(lit)) continue;
			prgLits.push_back(*it);
			ctx()->unmark(lit);
			--marked;
		}
	}
	for (LitVec::const_iterator it = solverCore.begin(); it != solverCore.end(); ++it) {
		if (ctx()->validVar(it->var()))
			ctx()->unmark(it->var());
	}
	return prgLits.size() == solverCore.size();
}